

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateFieldValueExpression
          (Generator *this,Printer *printer,char *obj_reference,FieldDescriptor *field,
          bool use_default)

{
  byte bVar1;
  long *plVar2;
  ulong uVar3;
  CppType CVar4;
  Type TVar5;
  EnumValueDescriptor *pEVar6;
  LogMessage *pLVar7;
  uint uVar8;
  int i_00;
  uint uVar9;
  uint uVar10;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *pFVar11;
  long i_01;
  FieldDescriptor *field_02;
  size_t i;
  ulong uVar12;
  char *pcVar13;
  char cVar14;
  string *this_00;
  string *this_01;
  long lVar15;
  string result;
  allocator local_ba;
  LogFinisher local_b9;
  string out;
  string local_98;
  Printer *local_78;
  string local_70;
  string local_50;
  
  this_00 = &result;
  this_01 = &result;
  CVar4 = FieldDescriptor::cpp_type(field);
  if (CVar4 == CPPTYPE_FLOAT) {
    pFVar11 = extraout_RDX;
    if (!use_default) {
LAB_00255f16:
      if (*(int *)(field + 0x4c) == 2) {
        (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                  (&result,(_anonymous_namespace_ *)field,pFVar11);
        std::__cxx11::string::string((string *)&out,obj_reference,(allocator *)&local_70);
        io::Printer::Print(printer,"+jspb.Message.getField($obj$, $index$)","index",&result,"obj",
                           &out);
      }
      else {
        pcVar13 = "GPBFieldOptional";
        if (*(int *)(field + 0x4c) == 3) {
          pcVar13 = "GPBFieldRepeated";
        }
        std::__cxx11::string::string((string *)&result,pcVar13 + 8,(allocator *)&local_50);
        (anonymous_namespace)::JSFieldIndex_abi_cxx11_(&out,(_anonymous_namespace_ *)field,field_02)
        ;
        std::__cxx11::string::string((string *)&local_70,obj_reference,(allocator *)&local_98);
        io::Printer::Print(printer,"jspb.Message.get$cardinality$FloatingPointField($obj$, $index$)"
                           ,"cardinality",&result,"index",&out,"obj",&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
LAB_00256080:
      std::__cxx11::string::~string((string *)&out);
      goto LAB_002561ed;
    }
LAB_00255eb9:
    io::Printer::Print(printer,"+");
  }
  else {
    CVar4 = FieldDescriptor::cpp_type(field);
    if (!use_default) {
      pFVar11 = field_00;
      if (CVar4 == CPPTYPE_DOUBLE) goto LAB_00255f16;
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                (&result,(_anonymous_namespace_ *)field,field_00);
      std::__cxx11::string::string((string *)&out,obj_reference,(allocator *)&local_70);
      io::Printer::Print(printer,"jspb.Message.getField($obj$, $index$)","index",&result,"obj",&out)
      ;
      goto LAB_00256080;
    }
    if (CVar4 == CPPTYPE_DOUBLE) goto LAB_00255eb9;
  }
  std::__cxx11::string::string((string *)&local_70,obj_reference,&local_ba);
  pFVar11 = field;
  (anonymous_namespace)::JSFieldIndex_abi_cxx11_(&local_50,(_anonymous_namespace_ *)field,field_01);
  if (*(int *)(field + 0x4c) == 3) {
    std::__cxx11::string::string((string *)&local_98,"[]",(allocator *)&result);
    goto LAB_00256190;
  }
  CVar4 = FieldDescriptor::cpp_type(field);
  switch(CVar4) {
  case CPPTYPE_INT32:
    SimpleItoa_abi_cxx11_(&result,(protobuf *)(ulong)*(uint *)(field + 0xa0),(int)i_01);
    std::__cxx11::string::string((string *)&local_98,(string *)&result);
    break;
  case CPPTYPE_INT64:
    SimpleItoa_abi_cxx11_(&result,*(protobuf **)(field + 0xa0),i_01);
    std::__cxx11::string::string((string *)&local_98,(string *)&result);
    this_00 = &result;
    break;
  case CPPTYPE_UINT32:
    SimpleItoa_abi_cxx11_(&result,(protobuf *)(ulong)*(uint *)(field + 0xa0),(int)i_01);
    std::__cxx11::string::string((string *)&local_98,(string *)&result);
    this_00 = &result;
    break;
  case CPPTYPE_UINT64:
    SimpleItoa_abi_cxx11_(&result,*(protobuf **)(field + 0xa0),i_01);
    std::__cxx11::string::string((string *)&local_98,(string *)&result);
    this_00 = &result;
    break;
  case CPPTYPE_DOUBLE:
    SimpleDtoa_abi_cxx11_(&result,(protobuf *)pFVar11,*(double *)(field + 0xa0));
    std::__cxx11::string::string((string *)&out,(string *)&result);
    anon_unknown_0::PostProcessFloat(&local_98,&out);
    goto LAB_0025617e;
  case CPPTYPE_FLOAT:
    SimpleFtoa_abi_cxx11_(&result,(protobuf *)pFVar11,*(float *)(field + 0xa0));
    std::__cxx11::string::string((string *)&out,(string *)&result);
    anon_unknown_0::PostProcessFloat(&local_98,&out);
LAB_0025617e:
    std::__cxx11::string::~string((string *)&out);
    this_00 = &result;
    break;
  case CPPTYPE_BOOL:
    pcVar13 = "false";
    if (field[0xa0] != (FieldDescriptor)0x0) {
      pcVar13 = "true";
    }
    std::__cxx11::string::string((string *)&local_98,pcVar13,(allocator *)&result);
    goto LAB_00256190;
  case CPPTYPE_ENUM:
    pEVar6 = FieldDescriptor::default_value_enum(field);
    SimpleItoa_abi_cxx11_(&local_98,(protobuf *)(ulong)*(uint *)(pEVar6 + 0x10),i_00);
    goto LAB_00256190;
  case CPPTYPE_STRING:
    TVar5 = FieldDescriptor::type(field);
    out._M_dataplus._M_p = (pointer)&out.field_2;
    local_78 = printer;
    if (TVar5 == TYPE_STRING) {
      out._M_string_length = 0;
      out.field_2._M_local_buf[0] = '\0';
      plVar2 = *(long **)(field + 0xa0);
      uVar12 = 0;
      while( true ) {
        uVar3 = plVar2[1];
        if (uVar3 <= uVar12) break;
        lVar15 = *plVar2;
        if (uVar12 + 1 < uVar3) {
          uVar9 = *(byte *)(lVar15 + uVar12 + 1) & 0x3f;
        }
        else {
          uVar9 = 0;
        }
        if (uVar12 + 2 < uVar3) {
          uVar8 = *(byte *)(lVar15 + uVar12 + 2) & 0x3f;
        }
        else {
          uVar8 = 0;
        }
        bVar1 = *(byte *)(lVar15 + uVar12);
        uVar10 = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          if ((bVar1 & 0xe0) == 0xc0) {
            if (uVar3 - uVar12 == 1) {
LAB_002565a1:
              internal::LogMessage::LogMessage
                        ((LogMessage *)&result,LOGLEVEL_WARNING,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                         ,799);
              pLVar7 = internal::LogMessage::operator<<
                                 ((LogMessage *)&result,"The default value for field ");
              pLVar7 = internal::LogMessage::operator<<(pLVar7,*(string **)(field + 8));
              pLVar7 = internal::LogMessage::operator<<
                                 (pLVar7,
                                  " was truncated since it contained invalid UTF-8 or codepoints outside the basic multilingual plane."
                                 );
              internal::LogFinisher::operator=(&local_b9,pLVar7);
              internal::LogMessage::~LogMessage((LogMessage *)&result);
              break;
            }
            uVar10 = uVar9 | (bVar1 & 0x1f) << 6;
            lVar15 = 2;
          }
          else {
            if ((uVar3 - uVar12 < 3) || ((bVar1 & 0xf0) != 0xe0)) goto LAB_002565a1;
            uVar10 = uVar8 | uVar9 << 6 | (uint)bVar1 << 0xc;
            lVar15 = 3;
          }
        }
        else {
          lVar15 = 1;
        }
        uVar9 = uVar10 & 0xffff;
        switch(uVar9) {
        case 8:
          break;
        case 9:
          break;
        case 10:
          break;
        case 0xb:
switchD_002563c4_caseD_b:
          if ((ushort)((ushort)uVar10 - 0x20) < 0x5f) {
            std::__cxx11::string::push_back((char)&out);
          }
          else {
            if ((ushort)uVar10 < 0x100) {
              StringPrintf_abi_cxx11_(&result,"\\x%02x");
              std::__cxx11::string::append((string *)&out);
            }
            else {
              StringPrintf_abi_cxx11_(&result,"\\u%04x");
              std::__cxx11::string::append((string *)&out);
            }
            std::__cxx11::string::~string((string *)&result);
          }
          goto LAB_0025643e;
        case 0xc:
          break;
        case 0xd:
          break;
        default:
          if ((((uVar9 != 0x5c) && (uVar9 != 0x26)) && (uVar9 != 0x27)) &&
             (((uVar9 != 0x3c && (uVar9 != 0x3d)) && ((uVar9 != 0x3e && (uVar9 != 0x22))))))
          goto switchD_002563c4_caseD_b;
        }
        std::__cxx11::string::append((char *)&out);
LAB_0025643e:
        uVar12 = uVar12 + lVar15;
      }
      std::operator+(&result,"\"",&out);
      std::operator+(&local_98,&result,"\"");
    }
    else {
      lVar15 = *(long *)(field + 0xa0);
      out._M_string_length = 0;
      out.field_2._M_local_buf[0] = '\0';
      for (uVar12 = 0; uVar12 < *(ulong *)(lVar15 + 8); uVar12 = uVar12 + 3) {
        cVar14 = (char)&out;
        std::__cxx11::string::push_back(cVar14);
        std::__cxx11::string::push_back(cVar14);
        std::__cxx11::string::push_back(cVar14);
        std::__cxx11::string::push_back(cVar14);
      }
      std::operator+(&result,"\"",&out);
      std::operator+(&local_98,&result,"\"");
    }
    printer = local_78;
    std::__cxx11::string::~string((string *)&result);
    this_00 = &out;
    break;
  case CPPTYPE_MESSAGE:
    std::__cxx11::string::string((string *)&local_98,"null",(allocator *)&result);
    goto LAB_00256190;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)&result,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0x32a);
    pLVar7 = internal::LogMessage::operator<<((LogMessage *)&result,"Shouldn\'t reach here.");
    internal::LogFinisher::operator=((LogFinisher *)&out,pLVar7);
    internal::LogMessage::~LogMessage((LogMessage *)&result);
    std::__cxx11::string::string((string *)&local_98,"",(allocator *)&result);
    goto LAB_00256190;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_00256190:
  io::Printer::Print(printer,"jspb.Message.getFieldWithDefault($obj$, $index$, $default$)","obj",
                     &local_70,"index",&local_50,"default",&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_50);
  this_01 = &local_70;
LAB_002561ed:
  std::__cxx11::string::~string((string *)this_01);
  return;
}

Assistant:

void Generator::GenerateFieldValueExpression(io::Printer* printer,
                                             const char *obj_reference,
                                             const FieldDescriptor* field,
                                             bool use_default) const {
  bool is_float_or_double =
      field->cpp_type() == FieldDescriptor::CPPTYPE_FLOAT ||
      field->cpp_type() == FieldDescriptor::CPPTYPE_DOUBLE;
  if (use_default) {
    if (is_float_or_double) {
      // Coerce "Nan" and "Infinity" to actual float values.
      //
      // This will change null to 0, but that doesn't matter since we're getting
      // with a default.
      printer->Print("+");
    }

    printer->Print(
        "jspb.Message.getFieldWithDefault($obj$, $index$, $default$)",
        "obj", obj_reference,
        "index", JSFieldIndex(field),
        "default", JSFieldDefault(field));
  } else {
    if (is_float_or_double) {
      if (field->is_required()) {
        // Use "+" to convert all fields to numeric (including null).
        printer->Print(
            "+jspb.Message.getField($obj$, $index$)",
            "index", JSFieldIndex(field),
            "obj", obj_reference);
      } else {
        // Converts "NaN" and "Infinity" while preserving null.
        printer->Print(
            "jspb.Message.get$cardinality$FloatingPointField($obj$, $index$)",
            "cardinality", field->is_repeated() ? "Repeated" : "Optional",
            "index", JSFieldIndex(field),
            "obj", obj_reference);
      }
    } else {
      printer->Print("jspb.Message.getField($obj$, $index$)",
                     "index", JSFieldIndex(field),
                     "obj", obj_reference);
    }
  }
}